

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::LongStressCaseInternal::DebugInfoRenderer::~DebugInfoRenderer(DebugInfoRenderer *this)

{
  ShaderProgram *this_00;
  
  this_00 = this->m_prog;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
  }
  operator_delete(this_00,0xd0);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&(this->m_ndxBuf).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(this->m_posBuf).super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

~DebugInfoRenderer		(void) { delete m_prog; }